

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_move16(m68k_info *info,int *data,int *modes)

{
  int iVar1;
  m68k_address_mode mVar2;
  long lVar3;
  m68k_address_mode *pmVar4;
  
  MCInst_setOpcode(info->inst,0x120);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
  pmVar4 = &(info->extension).operands[0].address_mode;
  lVar3 = 0;
  do {
    iVar1 = data[lVar3];
    mVar2 = modes[lVar3];
    pmVar4[-1] = M68K_OP_MEM;
    if ((mVar2 == M68K_AM_REGI_ADDR_POST_INC) || (mVar2 == M68K_AM_REG_DIRECT_ADDR)) {
      *pmVar4 = mVar2;
      (((cs_m68k_op *)(pmVar4 + -0xd))->field_0).reg = iVar1 + M68K_REG_A0;
    }
    else {
      *pmVar4 = mVar2;
      ((cs_m68k_op *)(pmVar4 + -0xd))->field_0 =
           (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)iVar1;
    }
    lVar3 = lVar3 + 1;
    pmVar4 = pmVar4 + 0xe;
  } while (lVar3 == 1);
  return;
}

Assistant:

static void build_move16(m68k_info *info, int data[2], int modes[2])
{
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE16, 2, 0);
	int i;

	for (i = 0; i < 2; ++i) {
		cs_m68k_op* op = &ext->operands[i];
		const int d = data[i];
		const int m = modes[i];

		op->type = M68K_OP_MEM;

		if (m == M68K_AM_REGI_ADDR_POST_INC || m == M68K_AM_REG_DIRECT_ADDR) {
			op->address_mode = m;
			op->reg = M68K_REG_A0 + d;
		} else {
			op->address_mode = m;
			op->imm = d;
		}
	}
}